

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::bitfield_insert_invalid_base_type
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderType shaderType_00;
  long lVar1;
  bool bVar2;
  char *__s;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  string shaderSource;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  allocator<char> local_99;
  string local_98;
  long local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  _Var6._M_p = (pointer)&local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff40,"bitfieldInsert: Invalid base type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != &local_b0) {
    operator_delete(_Var6._M_p,local_b0._M_allocated_capacity + 1);
  }
  lVar5 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar5];
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_99);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1cbc003);
      _Var6._M_p = (pointer)&local_b0;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar4) {
        local_b0._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_b0._8_8_ = plVar3[3];
      }
      else {
        local_b0._M_allocated_capacity = paVar4->_M_allocated_capacity;
        _Var6._M_p = (pointer)*plVar3;
      }
      lVar1 = plVar3[1];
      *plVar3 = (long)paVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_b0) {
        operator_delete(_Var6._M_p,local_b0._M_allocated_capacity + 1);
      }
      local_78 = lVar5;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar5 = 0;
      do {
        shaderType_00 =
             *(ShaderType *)
              ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar5);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                  ((string *)&stack0xffffffffffffff40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,shaderType_00,
                   *(DataType *)
                    ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar5),
                   TYPE_INT,TYPE_INT,(DataType)_Var6._M_p);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_98,_Var6._M_p,_Var6._M_p + lVar1)
        ;
        verifyShader(ctx,shaderType,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_b0) {
          operator_delete(_Var6._M_p,local_b0._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                  ((string *)&stack0xffffffffffffff40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,shaderType_00,
                   *(DataType *)
                    ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar5
                    ),TYPE_INT,TYPE_INT,(DataType)_Var6._M_p);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_70,_Var6._M_p,_Var6._M_p + lVar1)
        ;
        verifyShader(ctx,shaderType,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_b0) {
          operator_delete(_Var6._M_p,local_b0._M_allocated_capacity + 1);
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar5 = local_78;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void bitfield_insert_invalid_base_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_floatTypes));

	ctx.beginSection("bitfieldInsert: Invalid base type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_floatTypes[dataTypeNdx], s_intTypes[dataTypeNdx], glu::TYPE_INT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_floatTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], glu::TYPE_INT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}